

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_get_rsi_resumable(aec_stream *strm)

{
  uint8_t uVar1;
  internal_state *state_00;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  aec_stream *in_RDI;
  internal_state *state;
  
  state_00 = in_RDI->state;
  do {
    if (in_RDI->avail_in < (ulong)state_00->bytes_per_sample) {
      if (state_00->flush != 1) {
        return 0;
      }
      if (state_00->i == 0) {
        emit(state_00,0,state_00->bits);
        if (in_RDI->avail_out != 0) {
          if (state_00->direct_out == 0) {
            uVar1 = *state_00->cds;
            puVar2 = in_RDI->next_out;
            in_RDI->next_out = puVar2 + 1;
            *puVar2 = uVar1;
          }
          in_RDI->avail_out = in_RDI->avail_out - 1;
          state_00->flushed = 1;
        }
        return 0;
      }
      state_00->blocks_avail = state_00->i / in_RDI->block_size - 1;
      if (state_00->i % in_RDI->block_size != 0) {
        state_00->blocks_avail = state_00->blocks_avail + 1;
      }
      do {
        state_00->data_raw[state_00->i] = state_00->data_raw[state_00->i - 1];
        uVar4 = state_00->i + 1;
        state_00->i = uVar4;
      } while (uVar4 < in_RDI->rsi * in_RDI->block_size);
    }
    else {
      uVar3 = (*state_00->get_sample)(in_RDI);
      state_00->data_raw[state_00->i] = uVar3;
    }
    uVar4 = state_00->i + 1;
    state_00->i = uVar4;
    if (in_RDI->rsi * in_RDI->block_size <= uVar4) {
      if ((in_RDI->flags & 8) != 0) {
        (*state_00->preprocess)(in_RDI);
      }
      iVar5 = m_check_zero_block(in_RDI);
      return iVar5;
    }
  } while( true );
}

Assistant:

static int m_get_rsi_resumable(struct aec_stream *strm)
{
    /**
       Get RSI while input buffer is short.

       Let user provide more input. Once we got all input pad buffer
       to full RSI.
    */

    struct internal_state *state = strm->state;

    do {
        if (strm->avail_in >= state->bytes_per_sample) {
            state->data_raw[state->i] = state->get_sample(strm);
        } else {
            if (state->flush == AEC_FLUSH) {
                if (state->i > 0) {
                    state->blocks_avail = state->i / strm->block_size - 1;
                    if (state->i % strm->block_size)
                        state->blocks_avail++;
                    do
                        state->data_raw[state->i] =
                            state->data_raw[state->i - 1];
                    while(++state->i < strm->rsi * strm->block_size);
                } else {
                    /* Finish encoding by padding the last byte with
                     * zero bits. */
                    emit(state, 0, state->bits);
                    if (strm->avail_out > 0) {
                        if (!state->direct_out)
                            *strm->next_out++ = *state->cds;
                        strm->avail_out--;
                        state->flushed = 1;
                    }
                    return M_EXIT;
                }
            } else {
                return M_EXIT;
            }
        }
    } while (++state->i < strm->rsi * strm->block_size);

    if (strm->flags & AEC_DATA_PREPROCESS)
        state->preprocess(strm);

    return m_check_zero_block(strm);
}